

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O0

PsocksDataSink * pds_stdio(FILE **fp)

{
  void *pvVar1;
  ulong local_20;
  size_t i;
  PsocksDataSinkStdio *pdss;
  FILE **fp_local;
  
  pvVar1 = safemalloc(1,0x58,0);
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    setvbuf((FILE *)fp[local_20],(char *)0x0,2,0);
    stdio_sink_init((stdio_sink *)((long)pvVar1 + local_20 * 0x20),fp[local_20]);
    *(ulong *)((long)pvVar1 + local_20 * 8 + 0x48) = (long)pvVar1 + local_20 * 0x20 + 8;
  }
  *(code **)((long)pvVar1 + 0x40) = stdio_free;
  return (PsocksDataSink *)((long)pvVar1 + 0x40);
}

Assistant:

PsocksDataSink *pds_stdio(FILE *fp[2])
{
    PsocksDataSinkStdio *pdss = snew(PsocksDataSinkStdio);

    for (size_t i = 0; i < 2; i++) {
        setvbuf(fp[i], NULL, _IONBF, 0);
        stdio_sink_init(&pdss->sink[i], fp[i]);
        pdss->pds.s[i] = BinarySink_UPCAST(&pdss->sink[i]);
    }

    pdss->pds.free = stdio_free;

    return &pdss->pds;
}